

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O2

int ncnn::binary_op_2_3_4_20<ncnn::BinaryOp_x86_fma_functor::binary_op_sub>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  float fVar1;
  uint uVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  ulong uVar11;
  int iVar12;
  long lVar13;
  undefined1 (*pauVar14) [32];
  int iVar15;
  undefined1 (*pauVar16) [32];
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  
  uVar2 = b->c;
  iVar12 = b->h * b->w * b->d * b->elempack;
  Mat::create_like(c,b,opt->blob_allocator);
  iVar15 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    uVar17 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar17 = 0;
    }
    for (uVar11 = 0; uVar11 != uVar17; uVar11 = uVar11 + 1) {
      fVar1 = *a->data;
      auVar18._4_4_ = fVar1;
      auVar18._0_4_ = fVar1;
      auVar18._8_4_ = fVar1;
      auVar18._12_4_ = fVar1;
      auVar19._16_4_ = fVar1;
      auVar19._0_16_ = auVar18;
      auVar19._20_4_ = fVar1;
      auVar19._24_4_ = fVar1;
      auVar19._28_4_ = fVar1;
      pvVar3 = b->data;
      sVar4 = b->elemsize;
      sVar5 = b->cstep;
      pauVar16 = (undefined1 (*) [32])(sVar5 * uVar11 * sVar4 + (long)pvVar3);
      pvVar6 = c->data;
      sVar7 = c->elemsize;
      sVar8 = c->cstep;
      pauVar14 = (undefined1 (*) [32])(sVar8 * uVar11 * sVar7 + (long)pvVar6);
      lVar13 = 0;
      for (iVar15 = 0; iVar15 + 7 < iVar12; iVar15 = iVar15 + 8) {
        auVar10 = vsubps_avx(auVar19,*pauVar16);
        *pauVar14 = auVar10;
        pauVar16 = pauVar16 + 1;
        pauVar14 = pauVar14 + 1;
        lVar13 = lVar13 + 8;
      }
      auVar18 = vshufps_avx(auVar18,auVar18,0);
      for (; iVar15 + 3 < iVar12; iVar15 = iVar15 + 4) {
        auVar9 = vsubps_avx(auVar18,*(undefined1 (*) [16])*pauVar16);
        *(undefined1 (*) [16])*pauVar14 = auVar9;
        pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
        pauVar14 = (undefined1 (*) [32])(*pauVar14 + 0x10);
        lVar13 = lVar13 + 4;
      }
      for (; (int)lVar13 < iVar12; lVar13 = lVar13 + 1) {
        *(float *)((long)pvVar6 + lVar13 * 4 + sVar8 * sVar7 * uVar11) =
             fVar1 - *(float *)((long)pvVar3 + lVar13 * 4 + sVar5 * sVar4 * uVar11);
      }
    }
    iVar15 = 0;
  }
  return iVar15;
}

Assistant:

static int binary_op_2_3_4_20(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = b.w;
    int h = b.h;
    int d = b.d;
    int channels = b.c;
    int elempack = b.elempack;
    int size = w * h * d * elempack;

    // type 2 3 4 20
    c.create_like(b, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float a0 = a[0];
        const float* ptr = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _a0_avx512 = _mm512_set1_ps(a0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_a0_avx512, _p);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _a0_avx = _mm256_set1_ps(a0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_a0_avx, _p);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _a0 = _mm_set1_ps(a0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_a0, _p);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(a0, *ptr);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}